

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O0

Quat4f __thiscall Quat4f::conjugated(Quat4f *this)

{
  float *in_RSI;
  undefined8 extraout_XMM0_Qa;
  ulong uVar1;
  Quat4f QVar2;
  Quat4f *this_local;
  
  uVar1 = (ulong)(uint)-in_RSI[1];
  Quat4f(this,*in_RSI,-in_RSI[1],-in_RSI[2],-in_RSI[3]);
  QVar2.m_elements[2] = (float)(int)uVar1;
  QVar2.m_elements[3] = (float)(int)(uVar1 >> 0x20);
  QVar2.m_elements[0] = (float)(int)extraout_XMM0_Qa;
  QVar2.m_elements[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return (Quat4f)QVar2.m_elements;
}

Assistant:

Quat4f Quat4f::conjugated() const
{
	return Quat4f
	(
		 m_elements[ 0 ],
		-m_elements[ 1 ],
		-m_elements[ 2 ],
		-m_elements[ 3 ]
	);
}